

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall tcu::TextureCube::TextureCube(TextureCube *this,TextureCube *other)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int face_1;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *this_00;
  long lVar4;
  ulong uVar5;
  int face;
  long lVar6;
  ConstPixelBufferAccess *levels [6];
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68 [7];
  
  this->m_format = other->m_format;
  uVar1 = other->m_size;
  this->m_size = uVar1;
  (this->m_view).m_levels[0] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[1] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[2] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[3] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[4] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[5] = (ConstPixelBufferAccess *)0x0;
  uVar2 = 0x20;
  if (uVar1 != 0) {
    uVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  this_00 = this->m_access;
  uVar2 = 0x20 - uVar2;
  lVar6 = 0;
  memset(this->m_data,0,0x124);
  do {
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              *)(this_00 + -6),(ulong)uVar2);
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (this_00,(ulong)uVar2);
    local_68[lVar6] =
         (this_00->
         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
         _M_impl.super__Vector_impl_data._M_start;
    lVar6 = lVar6 + 1;
    this_00 = this_00 + 1;
  } while (lVar6 != 6);
  local_78 = (undefined4)local_68[4];
  uStack_74 = (undefined4)((ulong)local_68[4] >> 0x20);
  uStack_70 = (undefined4)local_68[5];
  uStack_6c = (undefined4)((ulong)local_68[5] >> 0x20);
  local_88 = (undefined4)local_68[2];
  uStack_84 = (undefined4)((ulong)local_68[2] >> 0x20);
  uStack_80 = (undefined4)local_68[3];
  uStack_7c = (undefined4)((ulong)local_68[3] >> 0x20);
  local_98 = (undefined4)local_68[0];
  uStack_94 = (undefined4)((ulong)local_68[0] >> 0x20);
  uStack_90 = (undefined4)local_68[1];
  uStack_8c = (undefined4)((ulong)local_68[1] >> 0x20);
  (this->m_view).m_numLevels = uVar2;
  *(ulong *)&(this->m_view).field_0x4 = CONCAT44(local_98,uStack_9c);
  *(ulong *)((long)(this->m_view).m_levels + 4) = CONCAT44(uStack_90,uStack_94);
  *(ulong *)((long)(this->m_view).m_levels + 0xc) = CONCAT44(local_88,uStack_8c);
  *(ulong *)((long)(this->m_view).m_levels + 0x14) = CONCAT44(uStack_80,uStack_84);
  *(ulong *)((long)(this->m_view).m_levels + 0x1c) = CONCAT44(local_78,uStack_7c);
  *(ulong *)((long)(this->m_view).m_levels + 0x24) = CONCAT44(uStack_70,uStack_74);
  *(undefined4 *)((long)(this->m_view).m_levels + 0x2c) = uStack_6c;
  if (uVar1 != 0) {
    uVar3 = 1;
    if (1 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    uVar5 = 0;
    do {
      lVar6 = 0xa0;
      lVar4 = 0;
      do {
        if (*(long *)(*(long *)((long)other + lVar6 + -0x90) + 8 + uVar5 * 0x10) != 0) {
          allocLevel(this,(CubeFace)lVar4,(int)uVar5);
          copy((EVP_PKEY_CTX *)(*(long *)((long)this->m_data + lVar6 + -0x10) + uVar5 * 0x28),
               (EVP_PKEY_CTX *)(*(long *)((long)other->m_data + lVar6 + -0x10) + uVar5 * 0x28));
        }
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar4 != 6);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
  }
  return;
}

Assistant:

TextureCube::TextureCube (const TextureCube& other)
	: m_format	(other.m_format)
	, m_size	(other.m_size)
{
	const int						numLevels		= computeMipPyramidLevels(m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_view = TextureCubeView(numLevels, levels);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < CUBEFACE_LAST; face++)
		{
			if (!other.isLevelEmpty((CubeFace)face, levelNdx))
			{
				allocLevel((CubeFace)face, levelNdx);
				copy(getLevelFace(levelNdx, (CubeFace)face),
					 other.getLevelFace(levelNdx, (CubeFace)face));
			}
		}
	}
}